

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O2

void test_regular_announcement(rtr_socket *socket)

{
  int iVar1;
  uint32_t sn;
  uint16_t in_SI;
  uint16_t session_id;
  size_t in_R8;
  long in_FS_OFFSET;
  uint32_t local_98 [4];
  aspa_record _records345 [1];
  uint32_t local_68 [4];
  update_callback _callbacks340 [1];
  undefined8 local_28;
  undefined8 uStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  begin_cache_response((uint8_t)socket,in_SI);
  local_28 = 0x44e0000044d;
  uStack_20 = 0x4500000044f;
  session_id = 0x44c;
  append_aspa('\x01','L',(uint32_t)&local_28,(uint32_t *)0x4,in_R8);
  end_cache_response(0xb5,session_id,sn);
  expected_callbacks = _callbacks340;
  _callbacks340[0].source = (aspa_table *)0x0;
  _callbacks340[0].record.customer_asn = 0x44c;
  _callbacks340[0].record.provider_count = 4;
  _callbacks340[0].record.provider_asns = local_68;
  local_68[0] = 0x44d;
  local_68[1] = 0x44e;
  local_68[2] = 0x44f;
  local_68[3] = 0x450;
  _callbacks340[0].type = ASPA_ADD;
  callback_count = 1;
  callback_index = 0;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x156,"void test_regular_announcement(struct rtr_socket *)");
  }
  if (callback_index == callback_count) {
    _records345[0].customer_asn = 0x44c;
    _records345[0].provider_count = 4;
    local_98[0] = 0x44d;
    local_98[1] = 0x44e;
    local_98[2] = 0x44f;
    local_98[3] = 0x450;
    _records345[0].provider_asns = local_98;
    assert_table(socket,_records345,1);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("callback_index == callback_count",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x157,"void test_regular_announcement(struct rtr_socket *)");
}

Assistant:

static void test_regular_announcement(struct rtr_socket *socket)
{
	// Test: regular announcement
	// Expect: OK
	// DB: inserted
	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1100, ASNS(1101, 1102, 1103, 1104));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 437);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1100, ASNS(1101, 1102, 1103, 1104))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket, RECORD(1100, ASNS(1101, 1102, 1103, 1104)));
}